

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O2

void ansv<unsigned_long,1,0,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  ulong uVar4;
  unsigned_long uVar5;
  uint __line;
  unsigned_long *puVar6;
  unsigned_long prefix;
  size_type sVar7;
  _Elt_pointer ppVar8;
  size_type sVar9;
  long lVar10;
  _Map_pointer pppVar11;
  long lVar12;
  unsigned_long uVar13;
  _Elt_pointer ppVar14;
  char *__assertion;
  ulong uVar15;
  pointer ppVar16;
  ulong uVar17;
  unsigned_long uVar18;
  size_t i_1;
  ulong uVar19;
  size_t i;
  ulong uVar20;
  pointer ppVar21;
  long lVar22;
  bool bVar23;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  q;
  unsigned_long local_min;
  pair<unsigned_long,_unsigned_long> local_158;
  unsigned_long local_148;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_b8;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_98;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_148 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Deque_base(&q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               );
  local_size = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3;
  prefix = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_size,comm);
  lVar10 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
LAB_001341e2:
  lVar12 = lVar10 + -1;
  if (lVar10 != 0) {
    while (q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppVar8 = q.
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar8 = q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (ppVar8[-1].first <=
          (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar12]) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    }
    do {
      puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00134273;
      ppVar8 = q.
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar8 = q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (puVar3[lVar12] != ppVar8[-1].first) goto LAB_00134273;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    } while( true );
  }
  local_58.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&allmins,&local_58,&local_78,(allocator_type *)&send_counts);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_move_assign(lr_mins,(_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&allmins);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&allmins);
  sVar7 = std::
          deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(&q);
  if (sVar7 == 0) {
    __assertion = "n_left_mins >= 1";
    __line = 0x60;
  }
  else {
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear(&q);
    uVar20 = 0;
LAB_0013432d:
    if (uVar20 < (ulong)((long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
      while (q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar8 = q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar8[-1].first <=
            (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar20]) break;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      }
      do {
        puVar3 = (pointer)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar20];
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_001343c9;
        ppVar8 = q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar8 = q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (puVar3 != (pointer)ppVar8[-1].first) goto LAB_001343c9;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      } while( true );
    }
    sVar9 = std::
            deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(&q);
    local_98._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_98._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_b8._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_b8._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_b8._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_b8._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::
    insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>,void>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)lr_mins,
               (lr_mins->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,&local_98,&local_b8);
    local_min = (q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
    if (sVar9 == 0) {
      __assertion = "n_right_mins >= 1";
      __line = 0x76;
      goto LAB_00134a12;
    }
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear(&q);
    if (sVar9 + sVar7 ==
        (long)(lr_mins->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(lr_mins->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 4) {
      mxx::allgather<unsigned_long>(&allmins,&local_min,comm);
      send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_counts,(long)comm->m_size,(value_type_conflict *)&send_displs,
                 (allocator_type *)&recv_counts);
      recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_displs,(long)comm->m_size,(value_type_conflict *)&recv_counts,
                 (allocator_type *)&recv_displs);
      iVar1 = comm->m_rank;
      lVar10 = (long)iVar1;
      if (0 < lVar10) {
        uVar19 = 0;
        lVar12 = lVar10;
        uVar20 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10 + -1];
        do {
          do {
            uVar15 = uVar19;
            if (lVar12 < 1) goto LAB_00134594;
            lVar12 = lVar12 + -1;
            uVar4 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar12];
            uVar5 = 1;
            uVar17 = uVar15;
            ppVar16 = (lr_mins->
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar15;
            do {
              uVar19 = uVar17;
              uVar13 = uVar5;
              if (sVar7 <= uVar19 + 1) break;
              puVar6 = &ppVar16->first;
              uVar5 = uVar13 + 1;
              uVar17 = uVar19 + 1;
              ppVar16 = ppVar16 + 1;
            } while (uVar4 <= *puVar6);
          } while (uVar20 < uVar4);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] = uVar13;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] = uVar15;
          uVar20 = uVar4;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12]);
      }
LAB_00134594:
      iVar2 = comm->m_size;
      if (iVar1 < iVar2 + -1) {
        ppVar16 = (lr_mins->
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        sVar9 = ((long)(lr_mins->
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar16 >> 4) - 1;
        uVar20 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10 + 1];
        do {
          do {
            uVar19 = sVar9;
            lVar10 = lVar10 + 1;
            if (iVar2 <= lVar10) goto LAB_00134638;
            uVar15 = uVar19;
            if (sVar7 < uVar19) {
              uVar15 = sVar7;
            }
            uVar4 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar10];
            uVar17 = uVar19;
            for (ppVar21 = ppVar16 + uVar19;
                (sVar9 = uVar15, sVar7 < uVar17 && (sVar9 = uVar17, uVar4 <= ppVar21->first));
                ppVar21 = ppVar21 + -1) {
              uVar17 = uVar17 - 1;
            }
          } while (uVar20 < uVar4);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = (uVar19 - sVar9) + 1;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = sVar9;
          uVar20 = uVar4;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10]);
      }
LAB_00134638:
      mxx::all2all<unsigned_long>(&recv_counts,&send_counts,comm);
      mxx::impl::get_displacements<unsigned_long>(&recv_displs,&recv_counts);
      uVar5 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      uVar13 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector(&recved,uVar5 + uVar13,(allocator_type *)&local_158);
      mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
                ((lr_mins->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,&send_counts,&send_displs,
                 recved.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&recv_counts,&recv_displs,comm);
      uVar18 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start[comm->m_rank];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_size);
      lVar10 = (uVar5 + uVar13) - uVar18;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      lVar12 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
      lVar22 = lVar12 >> 3;
      while( true ) {
        lVar22 = lVar22 + -1;
        lVar12 = lVar12 + -8;
        if (lVar22 == -1) break;
        update_nsv_queue<unsigned_long,1>
                  (left_nsv,&q,
                   (unsigned_long *)
                   ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar12),prefix + lVar22,prefix)
        ;
        local_158.first =
             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar22];
        local_158.second = prefix + lVar22;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&q,&local_158);
      }
      lVar22 = uVar18 << 4;
      lVar12 = lVar22;
      while( true ) {
        bVar23 = uVar18 == 0;
        uVar18 = uVar18 - 1;
        if ((bVar23) ||
           (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)) break;
        update_nsv_queue<unsigned_long,1>
                  (left_nsv,&q,
                   (unsigned_long *)
                   ((long)&recved.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar12),
                   *(size_t *)
                    ((long)&recved.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].second + lVar12),prefix);
        lVar12 = lVar12 + -0x10;
      }
      puVar3 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pppVar11 = q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppVar14 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first;
      for (ppVar8 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          ppVar8 != q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur; ppVar8 = ppVar8 + -1) {
        if (ppVar8 == ppVar14) {
          ppVar14 = pppVar11[-1];
          pppVar11 = pppVar11 + -1;
          puVar3[ppVar14[0x1f].second - prefix] = local_148;
          ppVar8 = ppVar14 + 0x20;
        }
        else {
          puVar3[ppVar8[-1].second - prefix] = local_148;
        }
      }
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      lVar12 = 0;
      for (uVar20 = 0;
          puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          uVar20 < (ulong)((long)(in->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
          uVar20 = uVar20 + 1) {
        update_nsv_queue<unsigned_long,0>
                  (right_nsv,&q,(unsigned_long *)((long)puVar3 + lVar12),prefix + uVar20,prefix);
        local_158.first =
             *(unsigned_long *)
              ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start + lVar12);
        local_158.second = prefix + uVar20;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&q,&local_158);
        lVar12 = lVar12 + 8;
      }
      while ((bVar23 = lVar10 != 0, lVar10 = lVar10 + -1, bVar23 &&
             (q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur))) {
        update_nsv_queue<unsigned_long,0>
                  (right_nsv,&q,
                   (unsigned_long *)
                   ((long)&(recved.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar22),
                   *(size_t *)
                    ((long)&(recved.
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->second + lVar22),prefix);
        lVar22 = lVar22 + 0x10;
      }
      puVar3 = (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      for (; q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur =
               q.
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur + -1) {
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first =
               q.
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node =
               q.
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          puVar3[q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first[0x1f].second - prefix] =
               local_148;
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur =
               q.
               super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
        }
        else {
          puVar3[q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - prefix] = local_148;
        }
      }
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::operator=(lr_mins,&recved);
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&recved.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Deque_base(&q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    );
      return;
    }
    __assertion = "n_right_mins + n_left_mins == lr_mins.size()";
    __line = 0x78;
  }
LAB_00134a12:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                ,__line,
                "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 1, right_type = 0, indexing_type = 0]"
               );
LAB_00134273:
  allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(lVar10 + (prefix - 1));
  allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar3[lVar12];
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&allmins);
  lVar10 = lVar12;
  goto LAB_001341e2;
LAB_001343c9:
  allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(prefix + uVar20);
  allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&allmins);
  uVar20 = uVar20 + 1;
  goto LAB_0013432d;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}